

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_region_reset_all_m68k(TCGContext_conflict2 *tcg_ctx)

{
  _Bool _Var1;
  
  (tcg_ctx->region).current = 0;
  (tcg_ctx->region).agg_size_full = 0;
  _Var1 = tcg_region_alloc__locked(tcg_ctx);
  if (!_Var1) {
    g_tree_ref(tcg_ctx->tree);
    g_tree_destroy(tcg_ctx->tree);
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
             ,0x1ca,"!err");
}

Assistant:

void tcg_region_reset_all(TCGContext *tcg_ctx)
{
    tcg_ctx->region.current = 0;
    tcg_ctx->region.agg_size_full = 0;

#ifndef NDEBUG
    bool err = tcg_region_initial_alloc__locked(tcg_ctx);
    g_assert(!err);
#else
    tcg_region_initial_alloc__locked(tcg_ctx);
#endif

    tcg_region_tree_reset_all(tcg_ctx);
}